

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PacketAllocator.cpp
# Opt level: O1

uint8_t * __thiscall pktalloc::Allocator::fallbackAllocate(Allocator *this,uint bytes)

{
  void *pvVar1;
  undefined8 *puVar2;
  uint8_t *puVar3;
  uint uVar4;
  int iVar5;
  
  iVar5 = (bytes + 0x1f >> 5) + 1;
  pvVar1 = calloc(1,(ulong)(uint)(iVar5 * 0x20) + 0x20);
  if (pvVar1 == (void *)0x0) {
    puVar2 = (undefined8 *)0x0;
  }
  else {
    uVar4 = (uint)pvVar1 & 0x1f;
    *(char *)((long)pvVar1 + (0x1f - (ulong)uVar4)) = (char)uVar4;
    puVar2 = (undefined8 *)((long)pvVar1 + (0x20 - (ulong)uVar4));
  }
  if (puVar2 == (undefined8 *)0x0) {
    puVar3 = (uint8_t *)0x0;
  }
  else {
    *puVar2 = 0;
    *(int *)(puVar2 + 1) = iVar5;
    puVar3 = (uint8_t *)(puVar2 + 4);
  }
  return puVar3;
}

Assistant:

uint8_t* Allocator::fallbackAllocate(unsigned bytes)
{
    // Calculate number of units required by this allocation
    // Note: +1 for the AllocationHeader
    const unsigned units = (bytes + kUnitSize - 1) / kUnitSize + 1;

    uint8_t* ptr = SIMDSafeAllocate(kUnitSize * units);
    if (!ptr) {
        return nullptr;
    }

    AllocationHeader* regionHeader = (AllocationHeader*)ptr;
#ifdef PKTALLOC_DEBUG
    regionHeader->Canary = AllocationHeader::kCanaryExpected;
#endif // PKTALLOC_DEBUG
    regionHeader->Header = nullptr;
    regionHeader->UsedUnits = units;

    return ptr + kUnitSize;
}